

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
vector<pbrt::ShapeHandle_const*>
          (vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *this,
          ShapeHandle *first,ShapeHandle *last,polymorphic_allocator<pbrt::ShapeHandle> *alloc)

{
  uintptr_t *puVar1;
  ShapeHandle *iter;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
            ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)this
             ,(long)last - (long)first >> 3);
  puVar1 = *(uintptr_t **)(this + 8);
  for (; first != last; first = first + 1) {
    *puVar1 = 0;
    *puVar1 = (first->
              super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
              ).bits;
    puVar1 = puVar1 + 1;
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }